

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  int iVar4;
  int32_t iVar5;
  ConstantManager *this_00;
  Constant *pCVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar7;
  Type *pTVar8;
  undefined4 extraout_var_01;
  SENode *pSVar9;
  IntConstant *int_constant;
  Constant *constant;
  int64_t value;
  Instruction *inst_local;
  ScalarEvolutionAnalysis *this_local;
  ScalarConstant *this_01;
  
  OVar2 = opt::Instruction::opcode(inst);
  if (OVar2 == OpConstantNull) {
    this_local = (ScalarEvolutionAnalysis *)CreateConstant(this,0);
  }
  else {
    OVar2 = opt::Instruction::opcode(inst);
    if (OVar2 != OpConstant) {
      __assert_fail("inst->opcode() == spv::Op::OpConstant",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,200,
                    "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                   );
    }
    uVar3 = opt::Instruction::NumInOperands(inst);
    if (uVar3 != 1) {
      __assert_fail("inst->NumInOperands() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis.cpp"
                    ,0xc9,
                    "SENode *spvtools::opt::ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction *)"
                   );
    }
    this_00 = IRContext::get_constant_mgr(this->context_);
    uVar3 = opt::Instruction::result_id(inst);
    pCVar6 = analysis::ConstantManager::FindDeclaredConstant(this_00,uVar3);
    if (pCVar6 == (Constant *)0x0) {
      this_local = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
    }
    else {
      iVar4 = (*pCVar6->_vptr_Constant[0xe])();
      this_01 = (ScalarConstant *)CONCAT44(extraout_var,iVar4);
      if (this_01 != (ScalarConstant *)0x0) {
        iVar4 = (*(this_01->super_Constant)._vptr_Constant[0x18])();
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           CONCAT44(extraout_var_00,iVar4));
        if (sVar7 == 1) {
          pTVar8 = analysis::Constant::type((Constant *)this_01);
          iVar4 = (*pTVar8->_vptr_Type[10])();
          bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var_01,iVar4));
          if (bVar1) {
            iVar5 = analysis::IntConstant::GetS32BitValue((IntConstant *)this_01);
            constant = (Constant *)(long)iVar5;
          }
          else {
            uVar3 = analysis::ScalarConstant::GetU32BitValue(this_01);
            constant = (Constant *)(ulong)uVar3;
          }
          pSVar9 = CreateConstant(this,(int64_t)constant);
          return pSVar9;
        }
      }
      this_local = (ScalarEvolutionAnalysis *)CreateCantComputeNode(this);
    }
  }
  return (SENode *)this_local;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeConstant(const Instruction* inst) {
  if (inst->opcode() == spv::Op::OpConstantNull) return CreateConstant(0);

  assert(inst->opcode() == spv::Op::OpConstant);
  assert(inst->NumInOperands() == 1);
  int64_t value = 0;

  // Look up the instruction in the constant manager.
  const analysis::Constant* constant =
      context_->get_constant_mgr()->FindDeclaredConstant(inst->result_id());

  if (!constant) return CreateCantComputeNode();

  const analysis::IntConstant* int_constant = constant->AsIntConstant();

  // Exit out if it is a 64 bit integer.
  if (!int_constant || int_constant->words().size() != 1)
    return CreateCantComputeNode();

  if (int_constant->type()->AsInteger()->IsSigned()) {
    value = int_constant->GetS32BitValue();
  } else {
    value = int_constant->GetU32BitValue();
  }

  return CreateConstant(value);
}